

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

string * __thiscall LTFlightData::ComposeLabel_abi_cxx11_(LTFlightData *this)

{
  bool bVar1;
  flightPhaseE fVar2;
  ulong uVar3;
  long in_RSI;
  string *in_RDI;
  double dVar4;
  system_error *e;
  LTChannel *pChn;
  positionTy *pos;
  string label;
  LabelCfgTy cfg;
  lock_guard<std::recursive_mutex> lock;
  LTAircraft *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  LTChannel **in_stack_fffffffffffffe30;
  LTFlightData *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  double in_stack_fffffffffffffe68;
  string local_120 [32];
  string local_100 [38];
  byte local_da;
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  positionTy *local_58;
  undefined4 local_50;
  allocator<char> local_49;
  string local_48 [32];
  LabelCfgTy local_28;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffe20,
             (mutex_type *)in_stack_fffffffffffffe18);
  local_28 = DataRefs::GetLabelCfg(&dataRefs);
  std::__cxx11::string::string(local_48,(string *)(in_RSI + 0x38));
  if (*(long *)(in_RSI + 0x360) != 0) {
    bVar1 = DataRefs::LabelShowForParked(&dataRefs);
    if ((!bVar1) &&
       (fVar2 = LTAircraft::GetFlightPhase(*(LTAircraft **)(in_RSI + 0x360)), fVar2 == FPH_PARKED))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      std::allocator<char>::~allocator(&local_49);
      goto LAB_001d3137;
    }
    local_58 = LTAircraft::GetPPos(*(LTAircraft **)(in_RSI + 0x360));
    if (((ushort)local_28._0_2_ >> 8 & 1) != 0) {
      LTAircraft::GetFlightPhaseString_abi_cxx11_(in_stack_fffffffffffffe18);
      std::__cxx11::string::operator+=(local_48,local_78);
      std::__cxx11::string::~string(local_78);
      trim(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      std::__cxx11::string::operator+=(local_48,' ');
    }
    if (((ushort)local_28._0_2_ >> 9 & 1) != 0) {
      dVar4 = positionTy::heading(local_58);
      lround(dVar4);
      std::__cxx11::to_string((long)in_stack_fffffffffffffe68);
      std::__cxx11::string::operator+=(local_48,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::operator+=(local_48,' ');
    }
    if (((ushort)local_28._0_2_ >> 10 & 1) != 0) {
      dVar4 = positionTy::alt_ft((positionTy *)0x1d2cf0);
      lround(dVar4);
      std::__cxx11::to_string((long)in_stack_fffffffffffffe68);
      std::__cxx11::string::operator+=(local_48,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::operator+=(local_48,' ');
    }
    if (((ushort)local_28._0_2_ >> 0xb & 1) != 0) {
      local_da = 0;
      bVar1 = XPMP2::Aircraft::IsOnGrnd(*(Aircraft **)(in_RSI + 0x360));
      if (bVar1) {
        positionTy::GrndE2String(GND_ON);
        std::allocator<char>::allocator();
        local_da = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50))
        ;
      }
      else {
        in_stack_fffffffffffffe68 = LTAircraft::GetPHeight_ft((LTAircraft *)0x1d2e17);
        std::__cxx11::to_string((long)in_stack_fffffffffffffe68);
      }
      std::__cxx11::string::operator+=(local_48,local_d8);
      std::__cxx11::string::~string(local_d8);
      if ((local_da & 1) != 0) {
        std::allocator<char>::~allocator(&local_d9);
      }
      trim(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      std::__cxx11::string::operator+=(local_48,' ');
    }
    if (((ushort)local_28._0_2_ >> 0xc & 1) != 0) {
      dVar4 = LTAircraft::GetSpeed_kt((LTAircraft *)0x1d2f29);
      lround(dVar4);
      std::__cxx11::to_string((long)in_stack_fffffffffffffe68);
      std::__cxx11::string::operator+=(local_48,local_100);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::operator+=(local_48,' ');
    }
    if (((ushort)local_28._0_2_ >> 0xd & 1) != 0) {
      dVar4 = LTAircraft::GetVSI_ft(*(LTAircraft **)(in_RSI + 0x360));
      lround(dVar4);
      std::__cxx11::to_string((long)in_stack_fffffffffffffe68);
      std::__cxx11::string::operator+=(local_48,local_120);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::operator+=(local_48,' ');
    }
    if (((ushort)local_28._0_2_ >> 0xe & 1) != 0) {
      GetCurrChannel(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::string((string *)in_RDI,local_48);
LAB_001d3137:
  local_50 = 1;
  std::__cxx11::string::~string(local_48);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1d3151);
  return in_RDI;
}

Assistant:

std::string LTFlightData::ComposeLabel() const
{
    try {
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

        // the configuration: which parts to include in the label?
        const DataRefs::LabelCfgTy cfg = dataRefs.GetLabelCfg();
        std::string label(labelStat);       // copy static parts
        
        // only possible if we have an aircraft
        if (pAc) {
            // If aircraft is parked and we shall not show labels for parked a/c, then return nothing
            if (!dataRefs.LabelShowForParked() &&
                pAc->GetFlightPhase() == FPH_PARKED)
                return "";
            
            // current position of a/c
            const positionTy& pos = pAc->GetPPos();
            // add more items as per configuration
            if (cfg.bPhase) { label +=  pAc->GetFlightPhaseString(); trim(label); label += ' '; }
            ADD_LABEL_NUM(cfg.bHeading,     pos.heading());
            ADD_LABEL_NUM(cfg.bAlt,         pos.alt_ft());
            if (cfg.bHeightAGL) {
                label += pAc->IsOnGrnd() ? positionTy::GrndE2String(GND_ON) :
                           std::to_string(long(pAc->GetPHeight_ft()));
                trim(label);
                label += ' ';
            }
            ADD_LABEL_NUM(cfg.bSpeed,       pAc->GetSpeed_kt());
            ADD_LABEL_NUM(cfg.bVSI,         pAc->GetVSI_ft());
            if (cfg.bChannel) {
                const LTChannel* pChn = nullptr;
                if (GetCurrChannel(pChn) && pChn) {
                    label += pChn->ChName();
                    label += ' ';
                }
            }
        }
        
        // remove the trailing space
        if (!label.empty())
            label.pop_back();
        
        return label;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    return "?";
}